

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStaticEnumerator.cpp
# Opt level: O2

bool __thiscall
Js::JavascriptStaticEnumerator::Initialize
          (JavascriptStaticEnumerator *this,JavascriptEnumerator *prefixEnumerator,
          ArrayObject *arrayToEnumerate,DynamicObject *objectToEnumerate,EnumeratorFlags flags,
          ScriptContext *requestContext,EnumeratorCache *enumeratorCache)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  JavascriptEnumerator *ptr;
  
  Memory::WriteBarrierPtr<Js::JavascriptEnumerator>::WriteBarrierSet
            (&this->prefixEnumerator,prefixEnumerator);
  if (arrayToEnumerate == (ArrayObject *)0x0) {
    ptr = (JavascriptEnumerator *)0x0;
  }
  else {
    iVar2 = (*(arrayToEnumerate->super_DynamicObject).super_RecyclableObject.super_FinalizableObject
              .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x6f])
                      (arrayToEnumerate,(ulong)flags,requestContext);
    ptr = (JavascriptEnumerator *)CONCAT44(extraout_var,iVar2);
  }
  Memory::WriteBarrierPtr<Js::JavascriptEnumerator>::WriteBarrierSet(&this->arrayEnumerator,ptr);
  if (prefixEnumerator == (JavascriptEnumerator *)0x0) {
    prefixEnumerator = (this->arrayEnumerator).ptr;
  }
  Memory::WriteBarrierPtr<Js::JavascriptEnumerator>::WriteBarrierSet
            (&this->currentEnumerator,prefixEnumerator);
  bVar1 = DynamicObjectPropertyEnumerator::Initialize
                    (&this->propertyEnumerator,objectToEnumerate,flags,requestContext,
                     enumeratorCache);
  return bVar1;
}

Assistant:

bool JavascriptStaticEnumerator::Initialize(JavascriptEnumerator * prefixEnumerator, ArrayObject * arrayToEnumerate,
        DynamicObject * objectToEnumerate, EnumeratorFlags flags, ScriptContext * requestContext, EnumeratorCache * enumeratorCache)
    {
        this->prefixEnumerator = prefixEnumerator;
        this->arrayEnumerator = arrayToEnumerate ? arrayToEnumerate->GetIndexEnumerator(flags, requestContext) : nullptr;
        this->currentEnumerator = prefixEnumerator ? prefixEnumerator : PointerValue(arrayEnumerator);
        return this->propertyEnumerator.Initialize(objectToEnumerate, flags, requestContext, enumeratorCache);
    }